

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O1

void skiwi::compile_is_char(asmcode *code,compiler_options *param_2)

{
  operand local_40;
  operation local_3c;
  operand local_38 [2];
  
  local_3c = CMP;
  local_40 = CL;
  local_38[0] = NUMBER;
  local_38[1] = 0x17;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_3c,&local_40,local_38,(int *)(local_38 + 1));
  local_3c = SETE;
  local_40 = AL;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_3c,&local_40);
  local_3c = MOVZX;
  local_40 = RAX;
  local_38[0] = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_3c,&local_40,local_38);
  local_3c = SHL;
  local_40 = RAX;
  local_38[0] = NUMBER;
  local_38[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_3c,&local_40,local_38,(int *)(local_38 + 1));
  local_3c = OR;
  local_40 = RAX;
  local_38[0] = NUMBER;
  local_38[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_3c,&local_40,local_38,(int *)(local_38 + 1));
  local_3c = JMP;
  local_40 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_3c,&local_40);
  return;
}

Assistant:

void compile_is_char(asmcode& code, const compiler_options&)
  {
  code.add(asmcode::CMP, asmcode::CL, asmcode::NUMBER, char_tag);
  // if comparison (last cmp call) succeeded, then sete puts 1 in al, otherwise 0
  code.add(asmcode::SETE, asmcode::AL);
  // movzx extends the bits in al to the full rax register
  code.add(asmcode::MOVZX, asmcode::RAX, asmcode::AL);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 3);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::JMP, CONTINUE);
  }